

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathContextPtr xmlXPathNewContext(xmlDocPtr doc)

{
  xmlXPathContextPtr ctxt;
  xmlHashTablePtr pxVar1;
  
  ctxt = (xmlXPathContextPtr)(*xmlMalloc)(0x178);
  if (ctxt == (xmlXPathContextPtr)0x0) {
    xmlXPathErrMemory((xmlXPathContextPtr)0x0,"creating context\n");
  }
  else {
    memset(&ctxt->nb_variables_unused,0,0x168);
    ctxt->doc = doc;
    ctxt->node = (xmlNodePtr)0x0;
    ctxt->varHash = (xmlHashTablePtr)0x0;
    ctxt->nb_types = 0;
    ctxt->max_types = 0;
    ctxt->types = (xmlXPathTypePtr)0x0;
    pxVar1 = xmlHashCreate(0);
    ctxt->funcHash = pxVar1;
    ctxt->nsHash = (xmlHashTablePtr)0x0;
    ctxt->user = (void *)0x0;
    ctxt->nb_axis = 0;
    ctxt->max_axis = 0;
    ctxt->axis = (xmlXPathAxisPtr)0x0;
    ctxt->contextSize = -1;
    ctxt->proximityPosition = -1;
    xmlXPathRegisterAllFunctions(ctxt);
  }
  return ctxt;
}

Assistant:

xmlXPathContextPtr
xmlXPathNewContext(xmlDocPtr doc) {
    xmlXPathContextPtr ret;

    ret = (xmlXPathContextPtr) xmlMalloc(sizeof(xmlXPathContext));
    if (ret == NULL) {
        xmlXPathErrMemory(NULL, "creating context\n");
	return(NULL);
    }
    memset(ret, 0 , (size_t) sizeof(xmlXPathContext));
    ret->doc = doc;
    ret->node = NULL;

    ret->varHash = NULL;

    ret->nb_types = 0;
    ret->max_types = 0;
    ret->types = NULL;

    ret->funcHash = xmlHashCreate(0);

    ret->nb_axis = 0;
    ret->max_axis = 0;
    ret->axis = NULL;

    ret->nsHash = NULL;
    ret->user = NULL;

    ret->contextSize = -1;
    ret->proximityPosition = -1;

#ifdef XP_DEFAULT_CACHE_ON
    if (xmlXPathContextSetCache(ret, 1, -1, 0) == -1) {
	xmlXPathFreeContext(ret);
	return(NULL);
    }
#endif

    xmlXPathRegisterAllFunctions(ret);

    return(ret);
}